

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.cpp
# Opt level: O2

int tremove(lua_State *L)

{
  size_t sVar1;
  ulong uVar2;
  int iVar3;
  int n;
  int iVar4;
  
  luaL_checktype(L,1,5);
  sVar1 = lua_objlen(L,1);
  n = (int)sVar1;
  uVar2 = luaL_optinteger(L,2,(long)n);
  iVar4 = (int)uVar2;
  iVar3 = 0;
  if (iVar4 <= n && 0 < iVar4) {
    iVar3 = 1;
    lua_rawgeti(L,1,iVar4);
    while (iVar4 = (int)uVar2, n != iVar4) {
      lua_rawgeti(L,1,iVar4 + 1U);
      lua_rawseti(L,1,iVar4);
      uVar2 = (ulong)(iVar4 + 1U);
    }
    lua_pushnil(L);
    lua_rawseti(L,1,n);
  }
  return iVar3;
}

Assistant:

static int tremove (lua_State *L) {
  int e = aux_getn(L, 1);
  int pos = luaL_optint(L, 2, e);
  if (!(1 <= pos && pos <= e))  /* position is outside bounds? */
   return 0;  /* nothing to remove */
  luaL_setn(L, 1, e - 1);  /* t.n = n-1 */
  lua_rawgeti(L, 1, pos);  /* result = t[pos] */
  for ( ;pos<e; pos++) {
    lua_rawgeti(L, 1, pos+1);
    lua_rawseti(L, 1, pos);  /* t[pos] = t[pos+1] */
  }
  lua_pushnil(L);
  lua_rawseti(L, 1, e);  /* t[e] = nil */
  return 1;
}